

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O0

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::remove_vertex
          (DynamicPartialIndex *this,vertex_t v,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *out,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *in)

{
  vertex_t vVar1;
  priority_queue<std::pair<unsigned_int,unsigned_int>,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::less<std::pair<unsigned_int,unsigned_int>>>
  *ppVar2;
  uint uVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  bool bVar5;
  degree_t dVar6;
  reference pvVar7;
  size_type sVar8;
  const_reference pvVar9;
  mapped_type *pmVar10;
  reference ppVar11;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar12;
  reference pvVar13;
  mapped_type *pmVar14;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar15;
  Index *pIVar16;
  bool bVar17;
  allocator<unsigned_char> local_171;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_170;
  allocator<unsigned_char> local_151;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_150;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
  local_138;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
  local_130;
  reference local_128;
  pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *i_4;
  iterator __end4_1;
  iterator __begin4_1;
  Index *__range4_1;
  pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *i_3;
  iterator __end4;
  iterator __begin4;
  Index *__range4;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
  local_e0;
  allocator<unsigned_char> local_d1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  allocator<unsigned_char> local_a1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  reference local_88;
  pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *i_2;
  iterator __end5_1;
  iterator __begin5_1;
  Index *__range5_1;
  pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *i_1;
  iterator __end5;
  iterator __begin5;
  Index *__range5;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
  local_40;
  uint local_34;
  uint local_30;
  uint cur;
  uint deg;
  degree_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *out_local;
  DynamicPartialIndex *pDStack_10;
  vertex_t v_local;
  DynamicPartialIndex *this_local;
  
  _deg = in;
  in_local = out;
  out_local._4_4_ = v;
  pDStack_10 = this;
  std::
  unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::clear(&this->succ_temp_);
  std::
  swap<unsigned_int,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            (&this->succ_,&this->succ_temp_);
  std::
  unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::clear(&this->pred_temp_);
  std::
  swap<unsigned_int,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            (&this->pred_,&this->pred_temp_);
  set_degree(this);
  for (cur = 0; uVar3 = cur, dVar6 = Graph::num_vertices(this->graph_), uVar3 < dVar6; cur = cur + 1
      ) {
    ppVar2 = (priority_queue<std::pair<unsigned_int,unsigned_int>,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::less<std::pair<unsigned_int,unsigned_int>>>
              *)this->quedeg_;
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this->degree_,(ulong)cur);
    std::
    priority_queue<std::pair<unsigned_int,unsigned_int>,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::less<std::pair<unsigned_int,unsigned_int>>>
    ::emplace<unsigned_int&,unsigned_int&>(ppVar2,pvVar7,&cur);
  }
  while( true ) {
    bVar5 = std::
            priority_queue<std::pair<unsigned_int,_unsigned_int>,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>_>
            ::empty(this->quedeg_);
    bVar17 = false;
    if (!bVar5) {
      sVar8 = std::
              unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::size(&this->succ_);
      bVar17 = sVar8 != this->budget_;
    }
    if (!bVar17) break;
    pvVar9 = std::
             priority_queue<std::pair<unsigned_int,_unsigned_int>,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>_>
             ::top(this->quedeg_);
    local_30 = pvVar9->first;
    pvVar9 = std::
             priority_queue<std::pair<unsigned_int,_unsigned_int>,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>_>
             ::top(this->quedeg_);
    local_34 = pvVar9->second;
    std::
    priority_queue<std::pair<unsigned_int,_unsigned_int>,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>_>
    ::pop(this->quedeg_);
    if ((local_30 != 0) &&
       (pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           (this->degree_,(ulong)local_34), uVar3 = local_30, *pvVar7 != 0)) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         (this->degree_,(ulong)local_34);
      if (uVar3 == *pvVar7) {
        if ((this->isD2_ & 1U) == 0) {
          local_40._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::find(&this->succ_temp_,&local_34);
          __range5 = (Index *)std::
                              unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                              ::end(&this->succ_temp_);
          bVar17 = std::__detail::operator!=
                             (&local_40,
                              (_Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                               *)&__range5);
          if (bVar17) {
            pmVar14 = std::
                      unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      ::at(&this->succ_temp_,&local_34);
            pmVar10 = std::
                      unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      ::operator[](&this->succ_,&local_34);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(pmVar10,pmVar14);
            vVar1 = out_local._4_4_;
            pvVar4 = in_local;
            pvVar15 = Graph::graph(this->graph_);
            pvVar12 = Graph::reverse_graph(this->graph_);
            pmVar14 = std::
                      unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      ::at(&this->succ_,&local_34);
            update_remove(this,vVar1,pvVar4,pvVar15,pvVar12,pmVar14);
            pmVar14 = std::
                      unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      ::at(&this->pred_temp_,&local_34);
            pmVar10 = std::
                      unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      ::operator[](&this->pred_,&local_34);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(pmVar10,pmVar14);
            vVar1 = out_local._4_4_;
            pvVar4 = _deg;
            pvVar15 = Graph::reverse_graph(this->graph_);
            pvVar12 = Graph::graph(this->graph_);
            pmVar14 = std::
                      unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      ::at(&this->pred_,&local_34);
            update_remove(this,vVar1,pvVar4,pvVar15,pvVar12,pmVar14);
          }
          else {
            bVar17 = indexed(&this->parent_->D2_,local_34);
            if (bVar17) {
              pmVar14 = std::
                        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ::at(&(this->parent_->D2_).succ_,&local_34);
              pmVar10 = std::
                        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ::operator[](&this->succ_,&local_34);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(pmVar10,pmVar14)
              ;
              __end5 = std::
                       unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       ::begin(&this->succ_temp_);
              i_1 = (pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)std::
                       unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       ::end(&this->succ_temp_);
              while (bVar17 = std::__detail::operator!=
                                        (&__end5.
                                          super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                         ,(_Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                           *)&i_1), vVar1 = out_local._4_4_, pvVar4 = in_local,
                    bVar17) {
                ppVar11 = std::__detail::
                          _Node_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                          ::operator*(&__end5);
                pmVar14 = std::
                          unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          ::at(&this->succ_,&local_34);
                pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                    (pmVar14,(ulong)ppVar11->first);
                if (*pvVar13 != '?') {
                  vVar1 = ppVar11->first;
                  pvVar15 = Graph::graph(this->graph_);
                  pmVar14 = std::
                            unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                            ::at(&this->succ_,&local_34);
                  resume_bfs(this,vVar1,pvVar15,pmVar14);
                }
                std::__detail::
                _Node_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                ::operator++(&__end5);
              }
              pvVar15 = Graph::graph(this->graph_);
              pvVar12 = Graph::reverse_graph(this->graph_);
              pmVar14 = std::
                        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ::at(&this->succ_,&local_34);
              update_remove(this,vVar1,pvVar4,pvVar15,pvVar12,pmVar14);
              pmVar14 = std::
                        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ::at(&(this->parent_->D2_).pred_,&local_34);
              pmVar10 = std::
                        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ::operator[](&this->pred_,&local_34);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(pmVar10,pmVar14)
              ;
              __end5_1 = std::
                         unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         ::begin(&this->succ_temp_);
              i_2 = (pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)std::
                       unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       ::end(&this->succ_temp_);
              while (bVar17 = std::__detail::operator!=
                                        (&__end5_1.
                                          super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                         ,(_Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                           *)&i_2), vVar1 = out_local._4_4_, pvVar4 = _deg, bVar17)
              {
                local_88 = std::__detail::
                           _Node_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                           ::operator*(&__end5_1);
                pmVar14 = std::
                          unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          ::at(&this->pred_,&local_34);
                pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                    (pmVar14,(ulong)local_88->first);
                if (*pvVar13 != '?') {
                  vVar1 = local_88->first;
                  pvVar15 = Graph::reverse_graph(this->graph_);
                  pmVar14 = std::
                            unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                            ::at(&this->pred_,&local_34);
                  resume_bfs(this,vVar1,pvVar15,pmVar14);
                }
                std::__detail::
                _Node_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                ::operator++(&__end5_1);
              }
              pvVar15 = Graph::reverse_graph(this->graph_);
              pvVar12 = Graph::graph(this->graph_);
              pmVar14 = std::
                        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ::at(&this->pred_,&local_34);
              update_remove(this,vVar1,pvVar4,pvVar15,pvVar12,pmVar14);
            }
            else {
              dVar6 = Graph::num_vertices(this->graph_);
              std::allocator<unsigned_char>::allocator(&local_a1);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        (&local_a0,(ulong)dVar6,"?21DynamicScalableKReach",&local_a1);
              pmVar14 = std::
                        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ::operator[](&this->succ_,&local_34);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                        (pmVar14,&local_a0);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_a0);
              std::allocator<unsigned_char>::~allocator(&local_a1);
              uVar3 = local_34;
              pvVar15 = Graph::graph(this->graph_);
              pmVar14 = std::
                        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ::at(&this->succ_,&local_34);
              construct_bfs(this,uVar3,pvVar15,pmVar14);
              dVar6 = Graph::num_vertices(this->graph_);
              std::allocator<unsigned_char>::allocator(&local_d1);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        (&local_d0,(ulong)dVar6,"?21DynamicScalableKReach",&local_d1);
              pmVar14 = std::
                        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ::operator[](&this->pred_,&local_34);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                        (pmVar14,&local_d0);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_d0);
              std::allocator<unsigned_char>::~allocator(&local_d1);
              uVar3 = local_34;
              pvVar15 = Graph::reverse_graph(this->graph_);
              pmVar14 = std::
                        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ::at(&this->pred_,&local_34);
              construct_bfs(this,uVar3,pvVar15,pmVar14);
            }
          }
        }
        else {
          local_e0._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::find(&this->succ_temp_,&local_34);
          __range4 = (Index *)std::
                              unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                              ::end(&this->succ_temp_);
          bVar17 = std::__detail::operator!=
                             (&local_e0,
                              (_Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                               *)&__range4);
          if (bVar17) {
            pmVar14 = std::
                      unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      ::at(&this->succ_temp_,&local_34);
            pmVar10 = std::
                      unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      ::operator[](&this->succ_,&local_34);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(pmVar10,pmVar14);
            pIVar16 = &(this->parent_->D1_).succ_temp_;
            __end4 = std::
                     unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     ::begin(pIVar16);
            i_3 = (pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)std::
                     unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     ::end(pIVar16);
            while (bVar17 = std::__detail::operator!=
                                      (&__end4.
                                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                       ,(_Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                         *)&i_3), vVar1 = out_local._4_4_, pvVar4 = in_local, bVar17
                  ) {
              ppVar11 = std::__detail::
                        _Node_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                        ::operator*(&__end4);
              pmVar14 = std::
                        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ::at(&this->succ_,&local_34);
              pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                  (pmVar14,(ulong)ppVar11->first);
              if (*pvVar13 != '?') {
                vVar1 = ppVar11->first;
                pvVar15 = Graph::graph(this->graph_);
                pmVar14 = std::
                          unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          ::at(&this->succ_,&local_34);
                resume_bfs(this,vVar1,pvVar15,pmVar14);
              }
              std::__detail::
              _Node_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
              ::operator++(&__end4);
            }
            pvVar15 = Graph::graph(this->graph_);
            pvVar12 = Graph::reverse_graph(this->graph_);
            pmVar14 = std::
                      unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      ::at(&this->succ_,&local_34);
            update_remove(this,vVar1,pvVar4,pvVar15,pvVar12,pmVar14);
            pmVar14 = std::
                      unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      ::at(&this->pred_temp_,&local_34);
            pmVar10 = std::
                      unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      ::operator[](&this->pred_,&local_34);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(pmVar10,pmVar14);
            pIVar16 = &(this->parent_->D1_).succ_temp_;
            __end4_1 = std::
                       unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       ::begin(pIVar16);
            i_4 = (pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)std::
                     unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     ::end(pIVar16);
            while (bVar17 = std::__detail::operator!=
                                      (&__end4_1.
                                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                       ,(_Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                         *)&i_4), vVar1 = out_local._4_4_, pvVar4 = _deg, bVar17) {
              local_128 = std::__detail::
                          _Node_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                          ::operator*(&__end4_1);
              pmVar14 = std::
                        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ::at(&this->pred_,&local_34);
              pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                  (pmVar14,(ulong)local_128->first);
              if (*pvVar13 != '?') {
                vVar1 = local_128->first;
                pvVar15 = Graph::reverse_graph(this->graph_);
                pmVar14 = std::
                          unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          ::at(&this->pred_,&local_34);
                resume_bfs(this,vVar1,pvVar15,pmVar14);
              }
              std::__detail::
              _Node_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
              ::operator++(&__end4_1);
            }
            pvVar15 = Graph::reverse_graph(this->graph_);
            pvVar12 = Graph::graph(this->graph_);
            pmVar14 = std::
                      unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      ::at(&this->pred_,&local_34);
            update_remove(this,vVar1,pvVar4,pvVar15,pvVar12,pmVar14);
          }
          else {
            local_130._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ::find(&(this->parent_->D1_).succ_temp_,&local_34);
            local_138._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ::end(&(this->parent_->D1_).succ_temp_);
            bVar17 = std::__detail::operator!=(&local_130,&local_138);
            if (bVar17) {
              pmVar14 = std::
                        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ::at(&(this->parent_->D1_).succ_temp_,&local_34);
              pmVar10 = std::
                        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ::operator[](&this->succ_,&local_34);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(pmVar10,pmVar14)
              ;
              vVar1 = out_local._4_4_;
              pvVar4 = in_local;
              pvVar15 = Graph::graph(this->graph_);
              pvVar12 = Graph::reverse_graph(this->graph_);
              pmVar14 = std::
                        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ::at(&this->succ_,&local_34);
              update_remove(this,vVar1,pvVar4,pvVar15,pvVar12,pmVar14);
              pmVar14 = std::
                        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ::at(&(this->parent_->D1_).pred_temp_,&local_34);
              pmVar10 = std::
                        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ::operator[](&this->pred_,&local_34);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(pmVar10,pmVar14)
              ;
              vVar1 = out_local._4_4_;
              pvVar4 = _deg;
              pvVar15 = Graph::reverse_graph(this->graph_);
              pvVar12 = Graph::graph(this->graph_);
              pmVar14 = std::
                        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ::at(&this->pred_,&local_34);
              update_remove(this,vVar1,pvVar4,pvVar15,pvVar12,pmVar14);
            }
            else {
              dVar6 = Graph::num_vertices(this->graph_);
              std::allocator<unsigned_char>::allocator(&local_151);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        (&local_150,(ulong)dVar6,"?21DynamicScalableKReach",&local_151);
              pmVar14 = std::
                        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ::operator[](&this->succ_,&local_34);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                        (pmVar14,&local_150);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_150);
              std::allocator<unsigned_char>::~allocator(&local_151);
              uVar3 = local_34;
              pvVar15 = Graph::graph(this->graph_);
              pmVar14 = std::
                        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ::at(&this->succ_,&local_34);
              construct_bfs(this,uVar3,pvVar15,pmVar14);
              dVar6 = Graph::num_vertices(this->graph_);
              std::allocator<unsigned_char>::allocator(&local_171);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        (&local_170,(ulong)dVar6,"?21DynamicScalableKReach",&local_171);
              pmVar14 = std::
                        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ::operator[](&this->pred_,&local_34);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                        (pmVar14,&local_170);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_170);
              std::allocator<unsigned_char>::~allocator(&local_171);
              uVar3 = local_34;
              pvVar15 = Graph::reverse_graph(this->graph_);
              pmVar14 = std::
                        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ::at(&this->pred_,&local_34);
              construct_bfs(this,uVar3,pvVar15,pmVar14);
            }
          }
        }
        std::
        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::erase(&this->succ_temp_,&local_34);
        std::
        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::erase(&this->pred_temp_,&local_34);
        update_cover(this,local_34);
      }
      else {
        ppVar2 = (priority_queue<std::pair<unsigned_int,unsigned_int>,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::less<std::pair<unsigned_int,unsigned_int>>>
                  *)this->quedeg_;
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           (this->degree_,(ulong)local_34);
        std::
        priority_queue<std::pair<unsigned_int,unsigned_int>,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::less<std::pair<unsigned_int,unsigned_int>>>
        ::emplace<unsigned_int&,unsigned_int&>(ppVar2,pvVar7,&local_34);
      }
    }
  }
  while (bVar17 = std::
                  priority_queue<std::pair<unsigned_int,_unsigned_int>,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>_>
                  ::empty(this->quedeg_), ((bVar17 ^ 0xffU) & 1) != 0) {
    std::
    priority_queue<std::pair<unsigned_int,_unsigned_int>,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>_>
    ::pop(this->quedeg_);
  }
  return;
}

Assistant:

void DynamicScalableKReach::DynamicPartialIndex::remove_vertex(vertex_t v, const std::vector<vertex_t> &out,
                                                               const std::vector<vertex_t> &in) {
    succ_temp_.clear();
    swap(succ_, succ_temp_);
    pred_temp_.clear();
    swap(pred_, pred_temp_);
    set_degree();
    for (degree_t i = 0; i < graph_.num_vertices(); ++i) {
        quedeg_.emplace(degree_.at(i), i);
    }
    while (!quedeg_.empty() && succ_.size() != budget_) {
        auto deg = quedeg_.top().first;
        auto cur = quedeg_.top().second;
        quedeg_.pop();
        if (deg <= 0 || degree_.at(cur) <= 0) {
            continue;
        }
        if (deg != degree_.at(cur)) {
            quedeg_.emplace(degree_.at(cur), cur);
            continue;
        }
        if (!isD2_) { // is D1
            if (succ_temp_.find(cur) != succ_temp_.end()) { // was indexed
                succ_[cur] = move(succ_temp_.at(cur));
                update_remove(v, out, graph_.graph(), graph_.reverse_graph(), succ_.at(cur));
                pred_[cur] = move(pred_temp_.at(cur));
                update_remove(v, in, graph_.reverse_graph(), graph_.graph(), pred_.at(cur));
            }
            else if (parent_.D2_.indexed(cur)) { // indexed in D2
                succ_[cur] = move(parent_.D2_.succ_.at(cur));
                for (const auto &i : succ_temp_) {
                    if (succ_.at(cur).at(i.first) != INF8) {
                        resume_bfs(i.first, graph_.graph(), succ_.at(cur));
                    }
                }
                update_remove(v, out, graph_.graph(), graph_.reverse_graph(), succ_.at(cur));
                pred_[cur] = move(parent_.D2_.pred_.at(cur));
                for (const auto &i : succ_temp_) {
                    if (pred_.at(cur).at(i.first) != INF8) {
                        resume_bfs(i.first, graph_.reverse_graph(), pred_.at(cur));
                    }
                }
                update_remove(v, in, graph_.reverse_graph(), graph_.graph(), pred_.at(cur));
            }
            else { // not indexed before
                succ_[cur] = vector<distance_t>(graph_.num_vertices(), INF8);
                construct_bfs(cur, graph_.graph(), succ_.at(cur));
                pred_[cur] = vector<distance_t>(graph_.num_vertices(), INF8);
                construct_bfs(cur, graph_.reverse_graph(), pred_.at(cur));
            }
        }
        else { // is D2
            if (succ_temp_.find(cur) != succ_temp_.end()) { // was indexed
                succ_[cur] = move(succ_temp_.at(cur));
                for (const auto &i : parent_.D1_.succ_temp_) {
                    if (succ_.at(cur).at(i.first) != INF8) {
                        resume_bfs(i.first, graph_.graph(), succ_.at(cur));
                    }
                }
                update_remove(v, out, graph_.graph(), graph_.reverse_graph(), succ_.at(cur));
                pred_[cur] = move(pred_temp_.at(cur));
                for (const auto &i : parent_.D1_.succ_temp_) {
                    if (pred_.at(cur).at(i.first) != INF8) {
                        resume_bfs(i.first, graph_.reverse_graph(), pred_.at(cur));
                    }
                }
                update_remove(v, in, graph_.reverse_graph(), graph_.graph(), pred_.at(cur));
            }
            else if (parent_.D1_.succ_temp_.find(cur) != parent_.D1_.succ_temp_.end()) { // was indexed in D1
                succ_[cur] = move(parent_.D1_.succ_temp_.at(cur));
                update_remove(v, out, graph_.graph(), graph_.reverse_graph(), succ_.at(cur));
                pred_[cur] = move(parent_.D1_.pred_temp_.at(cur));
                update_remove(v, in, graph_.reverse_graph(), graph_.graph(), pred_.at(cur));
            }
            else { // not indexed before
                succ_[cur] = vector<distance_t>(graph_.num_vertices(), INF8);
                construct_bfs(cur, graph_.graph(), succ_.at(cur));
                pred_[cur] = vector<distance_t>(graph_.num_vertices(), INF8);
                construct_bfs(cur, graph_.reverse_graph(), pred_.at(cur));
            }
        }
        succ_temp_.erase(cur);
        pred_temp_.erase(cur);
        update_cover(cur);
    }
    while (!quedeg_.empty()) {
        quedeg_.pop();
    }
}